

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall Memory::Recycler::ShouldIdleCollectOnExit(Recycler *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  DWORD DVar5;
  DWORD DVar6;
  ConfigFlagsTable *pCVar7;
  undefined4 *puVar8;
  uint32 nextTime;
  Recycler *this_local;
  
  ResetPartialHeuristicCounters(this);
  BVar4 = CollectionInProgress(this);
  if (BVar4 == 0) {
    pCVar7 = GetRecyclerFlagsTable(this);
    bVar3 = Js::Phases::IsEnabled(&pCVar7->Force,IdleCollectPhase);
    if (bVar3) {
      this_local._7_1_ = true;
    }
    else {
      uVar1 = this->tickCountNextCollection;
      if (((this->autoHeap).uncollectedAllocBytes <
           (ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesOnExit) ||
         (DVar5 = GetTickCount(), DVar5 <= uVar1 - 300)) {
        BVar4 = CollectionInProgress(this);
        if (BVar4 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x1aa4,"(!this->CollectionInProgress())",
                             "!this->CollectionInProgress()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        this_local._7_1_ = 0xfffff < (this->autoHeap).uncollectedAllocBytes;
      }
      else {
        pCVar7 = GetRecyclerFlagsTable(this);
        bVar3 = Js::Phases::IsEnabled(&pCVar7->Trace,IdleCollectPhase);
        if (bVar3) {
          if ((this->autoHeap).uncollectedAllocBytes <
              (ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesOnExit) {
            DVar5 = GetCurrentThreadId();
            uVar1 = this->tickCountNextCollection;
            DVar6 = GetTickCount();
            Output::Print(L"%04X> Idle collect on exit: time %d\n",(ulong)DVar5,
                          (ulong)(uVar1 - DVar6));
          }
          else {
            DVar5 = GetCurrentThreadId();
            Output::Print(L"%04X> Idle collect on exit: alloc %d\n",(ulong)DVar5,
                          (this->autoHeap).uncollectedAllocBytes);
          }
          Output::Flush();
        }
        CollectNow<(Memory::CollectionFlags)268439552>(this);
        this_local._7_1_ = false;
      }
    }
  }
  else {
    pCVar7 = GetRecyclerFlagsTable(this);
    bVar3 = Js::Phases::IsEnabled(&pCVar7->Trace,IdleCollectPhase);
    if ((bVar3) && (pCVar7 = GetRecyclerFlagsTable(this), (pCVar7->Verbose & 1U) != 0)) {
      DVar5 = GetCurrentThreadId();
      Output::Print(L"%04X> Skipping scheduling Idle Collect. Reason: Collection in progress\n",
                    (ulong)DVar5);
      Output::Flush();
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Recycler::ShouldIdleCollectOnExit()
{
    // Always reset partial heuristics even if we are not doing idle collecting
    // So we don't carry the heuristics to the next script activation
    this->ResetPartialHeuristicCounters();

    if (this->CollectionInProgress())
    {
#ifdef RECYCLER_TRACE
        CUSTOM_PHASE_PRINT_VERBOSE_TRACE1(GetRecyclerFlagsTable(), Js::IdleCollectPhase, _u("%04X> Skipping scheduling Idle Collect. Reason: Collection in progress\n"), ::GetCurrentThreadId());
#endif

        // Don't schedule an idle collect if there is a collection going on already
        // IDLE-GC-TODO: Fix ResetHeuristics in the GC so we can detect memory allocation during
        // the concurrent collect and still schedule an idle collect
        return false;
    }

    if (CUSTOM_PHASE_FORCE1(GetRecyclerFlagsTable(), Js::IdleCollectPhase))
    {
        return true;
    }

    uint32 nextTime = tickCountNextCollection - tickDiffToNextCollect;
    // We will try to start a concurrent collect if we are within .9 ms to next scheduled collection, AND,
    // the size of allocation is larger than 32M. This is similar to CollectionAllocation logic, just
    // earlier in both time heuristic and size heuristic, so we can do some concurrent GC while we are
    // not in script.
    if (autoHeap.uncollectedAllocBytes >= RecyclerHeuristic::Instance.MaxUncollectedAllocBytesOnExit
        && GetTickCount() > nextTime)
    {
#ifdef RECYCLER_TRACE
        if (CUSTOM_PHASE_TRACE1(GetRecyclerFlagsTable(), Js::IdleCollectPhase))
        {
            if (autoHeap.uncollectedAllocBytes >= RecyclerHeuristic::Instance.MaxUncollectedAllocBytesOnExit)
            {
                Output::Print(_u("%04X> Idle collect on exit: alloc %d\n"), ::GetCurrentThreadId(), autoHeap.uncollectedAllocBytes);
            }
            else
            {
                Output::Print(_u("%04X> Idle collect on exit: time %d\n"), ::GetCurrentThreadId(), tickCountNextCollection - GetTickCount());
            }
            Output::Flush();
        }
#endif

        this->CollectNow<CollectNowConcurrent>();
        return false;
    }

    Assert(!this->CollectionInProgress());
    // Idle GC use the size heuristic. Only need to schedule on if we passed it.
    return (autoHeap.uncollectedAllocBytes >= RecyclerHeuristic::IdleUncollectedAllocBytesCollection);
}